

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-tls.c
# Opt level: O2

void lws_tls_err_describe_clear(void)

{
  ulong e;
  char buf [160];
  
  while( true ) {
    e = ERR_get_error();
    if (e == 0) break;
    ERR_error_string_n(e,buf,0xa0);
    _lws_log(8,"   openssl error: %s\n",buf);
  }
  _lws_log(8,"\n");
  return;
}

Assistant:

void
lws_tls_err_describe_clear(void)
{
	char buf[160];
	unsigned long l;

	do {
		l = ERR_get_error();
		if (!l)
			break;

		ERR_error_string_n(
#if defined(LWS_WITH_BORINGSSL)
				(uint32_t)
#endif
				l, buf, sizeof(buf));
		lwsl_info("   openssl error: %s\n", buf);
	} while (l);
	lwsl_info("\n");
}